

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::injectImagesForKernel
          (CLIntercept *this,uint64_t enqueueCounter,cl_kernel kernel,cl_command_queue command_queue
          )

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  uint uVar3;
  _Base_ptr p_Var4;
  pointer pcVar5;
  int iVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  mapped_type *__k;
  iterator iVar11;
  long *plVar12;
  long lVar13;
  undefined8 uVar14;
  _Rb_tree_header *p_Var15;
  mapped_type *pmVar16;
  cl_kernel p_Var17;
  _Base_ptr p_Var18;
  ulong __new_size;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar19;
  float __x;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar20;
  cl_mem memobj;
  string prefix;
  vector<char,_std::allocator<char>_> transferBuf;
  size_t origin [3];
  string fileName;
  ifstream is;
  char tmpStr [256];
  pthread_mutex_t *local_440;
  _Base_ptr local_430;
  string local_428;
  vector<char,_std::allocator<char>_> local_408;
  key_type local_3e8;
  long lStack_3e0;
  long local_3d8;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  cl_kernel local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  cl_command_queue local_3a0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_398;
  CKernelInfoMap *local_390;
  CMemAllocNumberMap *local_388;
  CImageInfoMap *local_380;
  uint64_t local_378;
  _Rb_tree_node_base *local_370;
  _Rb_tree_node_base *local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  string local_340;
  int aiStack_320 [122];
  allocator local_138 [264];
  
  local_3c8 = kernel;
  local_3a0 = command_queue;
  local_378 = enqueueCounter;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
  if (iVar6 == 0) {
    local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    local_428._M_string_length = 0;
    local_428.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&local_340,sc_DumpDirectoryName,local_138);
    OS::Services_Common::GetDumpDirectoryNameWithoutPid
              (&(this->m_OS).super_Services_Common,&local_340,&local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p);
    }
    std::__cxx11::string::append((char *)&local_428);
    pmVar7 = std::
             map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
             ::operator[](&this->m_KernelArgMemMap,&local_3c8);
    p_Var18 = (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_370 = &(pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header;
    if (p_Var18 != local_370) {
      local_380 = &this->m_ImageInfoMap;
      p_Var1 = &(this->m_ImageInfoMap)._M_t._M_impl.super__Rb_tree_header;
      local_388 = &this->m_MemAllocNumberMap;
      local_390 = &this->m_KernelInfoMap;
      local_398 = &(this->m_LongKernelNameMap)._M_h;
      do {
        _Var2 = p_Var18[1]._M_color;
        p_Var4 = p_Var18[1]._M_parent;
        local_430 = p_Var4;
        local_368 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
        p_Var18 = (this->m_ImageInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var8 = &p_Var1->_M_header;
        for (; (_Rb_tree_header *)p_Var18 != (_Rb_tree_header *)0x0;
            p_Var18 = (&p_Var18->_M_left)[*(_Base_ptr *)(p_Var18 + 1) < p_Var4]) {
          if (*(_Base_ptr *)(p_Var18 + 1) >= p_Var4) {
            p_Var8 = p_Var18;
          }
        }
        p_Var15 = p_Var1;
        if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
           (p_Var15 = (_Rb_tree_header *)p_Var8,
           p_Var4 < (_Base_ptr)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
          p_Var15 = p_Var1;
        }
        if (p_Var15 != p_Var1) {
          pmVar9 = std::
                   map<_cl_mem_*,_CLIntercept::SImageInfo,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>_>
                   ::operator[](local_380,(key_type *)&local_430);
          local_340._M_dataplus._M_p = (pointer)local_430;
          pmVar10 = std::
                    map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
                    ::operator[](local_388,(key_type *)&local_340);
          uVar3 = *pmVar10;
          local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3c0,local_428._M_dataplus._M_p,
                     local_428._M_dataplus._M_p + local_428._M_string_length);
          snprintf((char *)local_138,0x100,"%04u",local_378);
          std::__cxx11::string::append((char *)&local_3c0);
          std::__cxx11::string::append((char *)&local_3c0);
          std::__cxx11::string::append((char *)&local_3c0);
          local_3e8 = local_3c8;
          __k = std::
                map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
                ::operator[](local_390,&local_3e8);
          iVar11 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(local_398,&__k->KernelName);
          pmVar16 = (mapped_type *)
                    ((long)iVar11.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                           ._M_cur + 0x28);
          if (iVar11.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            pmVar16 = __k;
          }
          local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
          pcVar5 = (pmVar16->KernelName)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_340,pcVar5,pcVar5 + (pmVar16->KernelName)._M_string_length);
          std::__cxx11::string::_M_append((char *)&local_3c0,(ulong)local_340._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != &local_340.field_2) {
            operator_delete(local_340._M_dataplus._M_p);
          }
          snprintf((char *)local_138,0x100,"%u",(ulong)_Var2);
          std::__cxx11::string::append((char *)&local_3c0);
          std::__cxx11::string::append((char *)&local_3c0);
          snprintf((char *)local_138,0x100,"%04u",(ulong)uVar3);
          std::__cxx11::string::append((char *)&local_3c0);
          std::__cxx11::string::append((char *)&local_3c0);
          snprintf((char *)local_138,0x100,"_%zux%zux%zu_%zubpp",pmVar9->Region[0],pmVar9->Region[1]
                   ,pmVar9->Region[2],pmVar9->ElementSize << 3);
          std::__cxx11::string::append((char *)&local_3c0);
          std::__cxx11::string::append((char *)&local_3c0);
          std::ifstream::ifstream(&local_340);
          std::ifstream::open((char *)&local_340,(_Ios_Openmode)local_3c0._M_dataplus._M_p);
          if (*(int *)((long)aiStack_320 + *(long *)(local_340._M_dataplus._M_p + -0x18)) == 0) {
            std::operator+(&local_360,"Injecting image file: ",&local_3c0);
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_360);
            p_Var17 = (cl_kernel)(plVar12 + 2);
            if ((cl_kernel)*plVar12 == p_Var17) {
              uVar19 = *(undefined4 *)p_Var17;
              uVar20 = *(undefined4 *)((long)plVar12 + 0x14);
              local_3d8 = *(long *)p_Var17;
              uStack_3d0 = (undefined4)plVar12[3];
              uStack_3cc = *(undefined4 *)((long)plVar12 + 0x1c);
              local_3e8 = (cl_kernel)&local_3d8;
            }
            else {
              local_3d8 = *(long *)p_Var17;
              uVar19 = extraout_XMM0_Da;
              uVar20 = extraout_XMM0_Db;
              local_3e8 = (cl_kernel)*plVar12;
            }
            lStack_3e0 = plVar12[1];
            *plVar12 = (long)p_Var17;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            log(this,(double)CONCAT44(uVar20,uVar19));
            if (local_3e8 != (cl_kernel)&local_3d8) {
              operator_delete(local_3e8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != &local_360.field_2) {
              operator_delete(local_360._M_dataplus._M_p);
            }
            std::istream::seekg((long)&local_340,_S_beg);
            lVar13 = std::istream::tellg();
            __x = (float)std::istream::seekg((long)&local_340,_S_beg);
            __new_size = pmVar9->Region[1] * pmVar9->Region[0] * pmVar9->Region[2] *
                         pmVar9->ElementSize;
            if (__new_size - lVar13 == 0) {
              if ((ulong)((long)local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start) < __new_size) {
                std::vector<char,_std::allocator<char>_>::resize(&local_408,__new_size);
              }
            }
            else {
              logf(this,__x);
            }
            if (__new_size <=
                (ulong)((long)local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start)) {
              std::istream::read((char *)&local_340,
                                 (long)local_408.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start);
              local_3e8 = (cl_kernel)0x0;
              lStack_3e0 = 0;
              local_3d8 = 0;
              (*(this->m_Dispatch).clEnqueueWriteImage)
                        (local_3a0,(cl_mem)local_430,1,(size_t *)&local_3e8,pmVar9->Region,0,0,
                         local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,0,(cl_event *)0x0,(cl_event *)0x0);
            }
          }
          std::ifstream::~ifstream(&local_340);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p);
          }
        }
        p_Var18 = local_368;
      } while (local_368 != local_370);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p);
    }
    if (local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
    return;
  }
  uVar14 = std::__throw_system_error(iVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p);
  }
  if (local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pthread_mutex_unlock(local_440);
  _Unwind_Resume(uVar14);
}

Assistant:

void CLIntercept::injectImagesForKernel(
    const uint64_t enqueueCounter,
    cl_kernel kernel,
    cl_command_queue command_queue )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    std::vector<char>   transferBuf;
    std::string prefix;

    OS().GetDumpDirectoryNameWithoutPid( sc_DumpDirectoryName, prefix );
    prefix += "/Inject/";

    CArgMemMap& kernelArgMemMap = m_KernelArgMemMap[ kernel ];
    CArgMemMap::iterator  i = kernelArgMemMap.begin();
    while( i != kernelArgMemMap.end() )
    {
        CLI_C_ASSERT( sizeof(void*) == sizeof(cl_mem) );

        cl_uint arg_index = (*i).first;
        cl_mem  memobj = (cl_mem)(*i).second;

        ++i;

        if( m_ImageInfoMap.find( memobj ) != m_ImageInfoMap.end() )
        {
            const SImageInfo&   info = m_ImageInfoMap[ memobj ];
            unsigned int        number = m_MemAllocNumberMap[ memobj ];

            std::string fileName( prefix );
            char    tmpStr[ MAX_PATH ];

            // Add the enqueue count to file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%04u",
                    (unsigned int)enqueueCounter );

                fileName += "Enqueue_";
                fileName += tmpStr;
            }

            // Add the kernel name to the file name
            {
                fileName += "_Kernel_";
                fileName += getShortKernelName(kernel);
            }

            // Add the arg number to the file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%u", arg_index );

                fileName += "_Arg_";
                fileName += tmpStr;
            }

            // Add the image number to the file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%04u", number );

                fileName += "_Image_";
                fileName += tmpStr;
            }

            // Add the image dimensions to the file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "_%zux%zux%zu_%zubpp",
                    info.Region[0],
                    info.Region[1],
                    info.Region[2],
                    info.ElementSize * 8 );

                fileName += tmpStr;
            }

            // Add extension to file name
            {
                fileName += ".raw";
            }

            std::ifstream is;
            is.open( fileName.c_str(), std::ios::in | std::ios::binary );
            if( is.good() )
            {
                log("Injecting image file: " + fileName + "\n");

                size_t  fileSize = 0;
                is.seekg( 0, std::ios::end );
                fileSize = (size_t)is.tellg();
                is.seekg( 0, std::ios::beg );

                size_t  size =
                    info.Region[0] *
                    info.Region[1] *
                    info.Region[2] *
                    info.ElementSize;

                if( size != fileSize )
                {
                    logf("Skipping injection: image size (%zu bytes) is not equal to file size (%zu bytes)!\n",
                        size, fileSize );
                }
                else if( transferBuf.size() < size )
                {
                    transferBuf.resize(size);
                }

                if( transferBuf.size() >= size )
                {
                    is.read( (char*)transferBuf.data(), size );

                    size_t  origin[3] = { 0, 0, 0 };
                    dispatch().clEnqueueWriteImage(
                        command_queue,
                        memobj,
                        CL_TRUE,
                        origin,
                        info.Region,
                        0,
                        0,
                        transferBuf.data(),
                        0,
                        NULL,
                        NULL );
                }
            }
        }
    }
}